

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LogFinish(void)

{
  FILE *__stream;
  _func_void_void_ptr_char_ptr *p_Var1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  if (GImGui->LogEnabled == true) {
    LogText("\n");
    __stream = (FILE *)pIVar2->LogFile;
    if (__stream != (FILE *)0x0) {
      if (__stream == _stdout) {
        fflush(__stream);
      }
      else {
        fclose(__stream);
      }
      pIVar2->LogFile = (FILE *)0x0;
    }
    if (2 < (pIVar2->LogClipboard).Buf.Size) {
      p_Var1 = (GImGui->IO).SetClipboardTextFn;
      if (p_Var1 != (_func_void_void_ptr_char_ptr *)0x0) {
        (*p_Var1)((GImGui->IO).ClipboardUserData,(pIVar2->LogClipboard).Buf.Data);
      }
      ImGuiTextBuffer::clear(&pIVar2->LogClipboard);
    }
    pIVar2->LogEnabled = false;
  }
  return;
}

Assistant:

void ImGui::LogFinish()
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    LogText(IM_NEWLINE);
    if (g.LogFile != NULL)
    {
        if (g.LogFile == stdout)
            fflush(g.LogFile);
        else
            fclose(g.LogFile);
        g.LogFile = NULL;
    }
    if (g.LogClipboard.size() > 1)
    {
        SetClipboardText(g.LogClipboard.begin());
        g.LogClipboard.clear();
    }
    g.LogEnabled = false;
}